

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O1

void DynamicProfileStorage::ClearCacheCatalog(void)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x3f4,"(enabled)","enabled");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (useCacheDir == true) {
    bVar2 = AcquireLock();
    if (bVar2) {
      bVar2 = CreateCacheCatalog();
      ReleaseLock();
      if (bVar2) {
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,DynamicProfileStoragePhase);
        if (bVar2) {
          Output::Print(L"TRACE: DynamicProfileStorage: Cache dir clears\n");
          Output::Flush();
          return;
        }
      }
    }
    return;
  }
  ClearInfoMap(false);
  return;
}

Assistant:

void DynamicProfileStorage::ClearCacheCatalog()
{
    AssertOrFailFast(enabled);
    if (useCacheDir)
    {
        if (!AcquireLock())
        {
            return;
        }
        bool success = CreateCacheCatalog();
        ReleaseLock();
        if (success)
        {
#if DBG_DUMP
            if (DynamicProfileStorage::DoTrace())
            {
                Output::Print(_u("TRACE: DynamicProfileStorage: Cache dir clears\n"));
                Output::Flush();
            }
#endif
            return;
        }
    }
    else
    {
        ClearInfoMap(false);
    }
}